

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile_impl.cc
# Opt level: O3

void __thiscall webrtc::EchoControlMobileImpl::Canceller::Canceller(Canceller *this)

{
  void *pvVar1;
  ostream *poVar2;
  FatalMessage local_180;
  
  pvVar1 = WebRtcAecm_Create();
  this->state_ = pvVar1;
  if (pvVar1 != (void *)0x0) {
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_control_mobile_impl.cc"
             ,0x55);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_180,"Check failed: state_",0x14);
  std::ios::widen((char)(ostream *)&local_180 + (char)*(undefined8 *)(local_180._0_8_ + -0x18));
  std::ostream::put((char)&local_180);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
  rtc::FatalMessage::~FatalMessage(&local_180);
}

Assistant:

Canceller() {
    state_ = WebRtcAecm_Create();
    RTC_CHECK(state_);
  }